

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

void __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::iterator_base<true>::increment_internal_node(iterator_base<true> *this)

{
  bool bVar1;
  reference pvVar2;
  index_pointer child;
  index_pointer local_b8;
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  local_b0;
  shared_ptr<const_void> local_98;
  index_pointer local_88;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_80;
  undefined8 local_68;
  size_t size;
  bool is_internal_node;
  uint local_4c;
  index_pointer iStack_48;
  uint shifts;
  parent_type parent;
  linear_node *linear;
  internal_node *internal;
  shared_ptr<const_void> node;
  iterator_base<true> *this_local;
  
  node.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  array_stack<pstore::index::details::parent_type,_13UL>::pop(&this->visited_parents_);
  bVar1 = array_stack<pstore::index::details::parent_type,_13UL>::empty(&this->visited_parents_);
  if (bVar1) {
    return;
  }
  std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)&internal);
  pvVar2 = array_stack<pstore::index::details::parent_type,_13UL>::top(&this->visited_parents_);
  iStack_48.addr_.a_ = *(address *)&pvVar2->node;
  parent.node = (index_pointer)pvVar2->position;
  local_4c = get_shift_bits(this);
  size._3_1_ = details::depth_is_internal_node(local_4c);
  local_68 = 0;
  if ((bool)size._3_1_) {
    local_88 = iStack_48;
    details::internal_node::get_node(&local_80,this->db_,iStack_48);
    std::tie<std::shared_ptr<void_const>,pstore::index::details::internal_node_const*>
              (&local_98,&internal);
    std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
    operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&> *)
              &local_98,&local_80);
    std::
    pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
    ::~pair(&local_80);
    assert_failed("internal != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x234);
  }
  local_b8 = iStack_48;
  details::linear_node::get_node(&local_b0,this->db_,iStack_48);
  std::tie<std::shared_ptr<void_const>,pstore::index::details::linear_node_const*>
            ((shared_ptr<const_void> *)&child.addr_,(linear_node **)&internal);
  std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::operator=
            ((tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> *)
             &child.addr_,&local_b0);
  std::
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  ::~pair(&local_b0);
  assert_failed("linear != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x238);
}

Assistant:

void hamt_map<KeyType, ValueType, Hash,
                      KeyEqual>::iterator_base<IsConstIterator>::increment_internal_node () {

            visited_parents_.pop ();

            if (!visited_parents_.empty ()) {
                std::shared_ptr<void const> node;
                internal_node const * internal = nullptr;
                linear_node const * linear = nullptr;

                details::parent_type parent = visited_parents_.top ();
                unsigned const shifts = this->get_shift_bits ();
                bool const is_internal_node = details::depth_is_internal_node (shifts);
                std::size_t size = 0;
                if (is_internal_node) {
                    std::tie (node, internal) = internal_node::get_node (db_, parent.node);
                    PSTORE_ASSERT (internal != nullptr);
                    size = internal->size ();
                } else {
                    std::tie (node, linear) = linear_node::get_node (db_, parent.node);
                    PSTORE_ASSERT (linear != nullptr);
                    size = linear->size ();
                }

                PSTORE_ASSERT (!parent.node.is_leaf () && parent.position < size);
                ++parent.position;

                if (parent.position >= size) {
                    this->increment_internal_node ();
                } else {
                    // Update the parent.
                    visited_parents_.top ().position = parent.position;

                    // Visit the child.
                    if (is_internal_node) {
                        index_pointer child = (*internal)[parent.position];
                        if (child.is_internal ()) {
                            this->move_to_left_most_child (child);
                        } else {
                            visited_parents_.push (details::parent_type{child});
                        }
                    } else {
                        visited_parents_.push (
                            details::parent_type{index_pointer{(*linear)[parent.position]}});
                    }
                }
            }
        }